

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack9_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  
  auVar6 = *(undefined1 (*) [16])in;
  auVar7 = vpmovsxbd_avx512f(_DAT_001ade10);
  *out = *in & 0x1ff;
  uVar2 = *(ulong *)(in + 4);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar2;
  auVar3 = vpalignr_avx(auVar11,auVar6,4);
  auVar4 = vpsllvd_avx2(auVar3,_DAT_001a04a0);
  auVar7 = vpermi2d_avx512f(auVar7,ZEXT1664(auVar6),ZEXT864(uVar2));
  auVar3 = vpshufd_avx(auVar11,0x54);
  auVar8 = vbroadcasti64x4_avx512f(_DAT_001940a0);
  auVar7 = vpsrlvd_avx512f(auVar7,_DAT_001b0100);
  uVar5 = (uint)(uVar2 >> 0x20);
  auVar6 = vpand_avx(auVar4,_DAT_001a04b0);
  auVar8 = vpermd_avx512f(auVar8,ZEXT1664(auVar6));
  auVar9 = vpbroadcastd_avx512f(ZEXT416(0x1ff));
  auVar10 = vpandd_avx512f(auVar7,auVar9);
  auVar7 = vpord_avx512f(auVar7,auVar8);
  auVar8._0_8_ = auVar10._0_8_;
  auVar8._8_4_ = auVar7._8_4_;
  auVar8._12_4_ = auVar10._12_4_;
  auVar8._16_4_ = auVar10._16_4_;
  auVar8._20_4_ = auVar10._20_4_;
  auVar8._24_4_ = auVar7._24_4_;
  auVar8._28_4_ = auVar10._28_4_;
  auVar8._32_4_ = auVar10._32_4_;
  auVar8._36_4_ = auVar7._36_4_;
  auVar8._40_4_ = auVar10._40_4_;
  auVar8._44_4_ = auVar10._44_4_;
  auVar8._48_4_ = auVar10._48_4_;
  auVar8._52_4_ = auVar7._52_4_;
  auVar8._56_4_ = auVar10._56_4_;
  auVar8._60_4_ = auVar10._60_4_;
  auVar4 = vpsrlvd_avx2(auVar3,_DAT_001ade00);
  auVar11 = auVar9._0_16_;
  auVar6 = vpinsrd_avx(auVar11,(uVar5 & 3) << 7,0);
  uVar1 = in[6];
  auVar7 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])(out + 1) = auVar7;
  auVar3 = vpor_avx(auVar4,auVar6);
  auVar6 = vpand_avx(auVar4,auVar11);
  auVar6 = vpblendd_avx2(auVar6,auVar3,1);
  *(undefined1 (*) [16])(out + 0x11) = auVar6;
  auVar6 = vpbroadcastd_avx512vl();
  auVar6 = vpsrlvd_avx2(auVar6,_DAT_001a1590);
  out[0x15] = uVar5 >> 0x1d | (uVar1 & 0x3f) << 3;
  auVar6 = vpand_avx(auVar6,auVar11);
  *(long *)(out + 0x16) = auVar6._0_8_;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack9_24(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 9);
  out++;
  *out = ((*in) >> 9) % (1U << 9);
  out++;
  *out = ((*in) >> 18) % (1U << 9);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 4)) << (9 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 9);
  out++;
  *out = ((*in) >> 13) % (1U << 9);
  out++;
  *out = ((*in) >> 22) % (1U << 9);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 8)) << (9 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 9);
  out++;
  *out = ((*in) >> 17) % (1U << 9);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 3)) << (9 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 9);
  out++;
  *out = ((*in) >> 12) % (1U << 9);
  out++;
  *out = ((*in) >> 21) % (1U << 9);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 7)) << (9 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 9);
  out++;
  *out = ((*in) >> 16) % (1U << 9);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 2)) << (9 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 9);
  out++;
  *out = ((*in) >> 11) % (1U << 9);
  out++;
  *out = ((*in) >> 20) % (1U << 9);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 6)) << (9 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 9);
  out++;
  *out = ((*in) >> 15) % (1U << 9);
  out++;

  return in + 1;
}